

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O0

Function *
stackjit::AssemblyImageLoader::loadFunctionDefinition
          (Function *__return_storage_ptr__,BinaryData *data,size_t *index)

{
  bool isExternal_00;
  bool bVar1;
  bool *pbVar2;
  string *psVar3;
  string local_1e8 [32];
  string local_1c8 [39];
  undefined1 local_1a1;
  _anonymous_namespace_ local_1a0 [8];
  string returnType;
  _anonymous_namespace_ local_180 [32];
  pointer local_160;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  unsigned_long numParameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  _anonymous_namespace_ local_d8 [48];
  _anonymous_namespace_ local_a8 [32];
  string local_88 [8];
  string memberFunctionName;
  string local_68 [8];
  string className;
  string local_48 [8];
  string name;
  bool isMemberFunction;
  bool isExternal;
  size_t *index_local;
  BinaryData *data_local;
  Function *function;
  
  isExternal_00 = anon_unknown_5::loadData<bool>(data,index);
  bVar1 = anon_unknown_5::loadData<bool>(data,index);
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  if (bVar1) {
    (anonymous_namespace)::loadString_abi_cxx11_(local_a8,data,index);
    std::__cxx11::string::operator=(local_68,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    (anonymous_namespace)::loadString_abi_cxx11_(local_d8,data,index);
    std::__cxx11::string::operator=(local_88,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::operator+(local_118,(char *)local_68);
    std::operator+(local_f8,local_118);
    std::__cxx11::string::operator=(local_48,(string *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_118);
  }
  else {
    (anonymous_namespace)::loadString_abi_cxx11_((_anonymous_namespace_ *)&numParameters,data,index)
    ;
    std::__cxx11::string::operator=(local_48,(string *)&numParameters);
    std::__cxx11::string::~string((string *)&numParameters);
  }
  parameters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)anon_unknown_5::loadData<unsigned_long>(data,index);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  for (local_160 = (pointer)0x0;
      local_160 <
      parameters.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage; local_160 = local_160 + 1) {
    (anonymous_namespace)::loadString_abi_cxx11_(local_180,data,index);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i,(value_type *)local_180);
    std::__cxx11::string::~string((string *)local_180);
  }
  (anonymous_namespace)::loadString_abi_cxx11_(local_1a0,data,index);
  local_1a1 = 0;
  std::__cxx11::string::string(local_1c8,local_48);
  std::__cxx11::string::string(local_1e8,(string *)local_1a0);
  Loader::Function::Function
            (__return_storage_ptr__,(string *)local_1c8,(string *)local_1e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,isExternal_00);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  pbVar2 = Loader::Function::isMemberFunction(__return_storage_ptr__);
  *pbVar2 = bVar1;
  psVar3 = Loader::Function::className_abi_cxx11_(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)psVar3,local_68);
  psVar3 = Loader::Function::memberFunctionName_abi_cxx11_(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)psVar3,local_88);
  local_1a1 = 1;
  std::__cxx11::string::~string((string *)local_1a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

Loader::Function AssemblyImageLoader::loadFunctionDefinition(BinaryData& data, std::size_t& index) {
		auto isExternal = loadData<bool>(data, index);
		auto isMemberFunction = loadData<bool>(data, index);

		std::string name;
		std::string className;
		std::string memberFunctionName;
		if (isMemberFunction) {
			className = loadString(data, index);
			memberFunctionName = loadString(data, index);
			name = className + "::" + memberFunctionName;
		} else {
			name = loadString(data, index);
		}

		auto numParameters = loadData<std::size_t>(data, index);
		std::vector<std::string> parameters;
		for (std::size_t i = 0; i < numParameters; i++) {
			parameters.push_back(loadString(data, index));
		}

		auto returnType = loadString(data, index);

		Loader::Function function(name, returnType, parameters, isExternal);
		function.isMemberFunction() = isMemberFunction;
		function.className() = className;
		function.memberFunctionName() = memberFunctionName;
		return function;
	}